

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManReadExpression(Prs_Man_t *p,int OutItem)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int local_44;
  int RangeSize;
  int nInputs;
  int Status;
  int fRotating;
  int Type;
  int Item;
  char *pClose;
  int OutItem_local;
  Prs_Man_t *p_local;
  
  bVar1 = false;
  Vec_IntClear(&p->vTemp);
  Vec_IntPush(&p->vTemp,0);
  Vec_IntPush(&p->vTemp,OutItem);
  iVar2 = Prs_ManUtilSkipSpaces(p);
  if (iVar2 == 0) {
    iVar2 = Prs_ManIsChar(p,'(');
    if (iVar2 != 0) {
      iVar2 = Prs_ManUtilDetectTwo(p,'>','>');
      if ((iVar2 != 0) && (iVar2 = Prs_ManUtilDetectTwo(p,'<','<'), iVar2 != 0)) {
        bVar1 = true;
      }
      pcVar4 = Prs_ManFindClosingParenthesis(p,'(',')');
      if (pcVar4 == (char *)0x0) {
        iVar2 = Prs_ManErrorSet(p,"Expecting closing parenthesis 1.",0);
        return iVar2;
      }
      *pcVar4 = ' ';
      *p->pCur = ' ';
    }
    iVar2 = Prs_ManUtilSkipSpaces(p);
    if (iVar2 == 0) {
      iVar2 = Prs_ManIsDigit(p);
      if ((iVar2 == 0) && (iVar2 = Prs_ManIsChar(p,'{'), iVar2 == 0)) {
        iVar2 = Prs_ManIsChar(p,'!');
        if ((((((iVar2 == 0) && (iVar2 = Prs_ManIsChar(p,'~'), iVar2 == 0)) &&
              (iVar2 = Prs_ManIsChar(p,'@'), iVar2 == 0)) &&
             ((iVar2 = Prs_ManIsChar(p,'&'), iVar2 == 0 &&
              (iVar2 = Prs_ManIsChar(p,'|'), iVar2 == 0)))) &&
            (iVar2 = Prs_ManIsChar(p,'^'), iVar2 == 0)) &&
           (iVar2 = Prs_ManIsChar(p,'-'), iVar2 == 0)) {
          iVar2 = Prs_ManReadSignal(p);
          if (iVar2 == 0) {
            iVar2 = Prs_ManErrorSet(p,"Cannot read name after a binary operator.",0);
            return iVar2;
          }
          iVar3 = Abc_Lit2Var2(iVar2);
          if (iVar3 == p->FuncNameId) {
            iVar2 = Prs_ManUtilSkipSpaces(p);
            if (iVar2 != 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
              return iVar2;
            }
            iVar2 = Prs_ManIsChar(p,'(');
            if (iVar2 == 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
              return iVar2;
            }
            p->pCur = p->pCur + 1;
            iVar2 = Prs_ManReadSignalList(p,&p->vTemp,')',1);
            iVar3 = Vec_IntSize(&p->vTemp);
            iVar3 = iVar3 / 2;
            if (p->FuncRangeId == 0) {
              local_44 = 1;
            }
            else {
              local_44 = Ptr_NtkRangeSize(p->pNtk,p->FuncRangeId);
            }
            p->FuncRangeId = 0;
            p->FuncNameId = 0;
            if (iVar2 == 0) {
              return 0;
            }
            if (iVar3 == 1) {
              Status = 0x2d;
            }
            else if (iVar3 == local_44 + 1) {
              Status = 0x29;
            }
            else {
              if (iVar3 != (1 << ((byte)local_44 & 0x1f)) + 1) {
                iVar2 = Prs_ManErrorSet(p,"Cannot determine word-level operator.",0);
                return iVar2;
              }
              Status = 0x28;
            }
            p->pCur = p->pCur + 1;
            iVar2 = Prs_ManUtilSkipSpaces(p);
            if (iVar2 != 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
              return iVar2;
            }
            Vec_IntInsert(&p->vTemp,0,0);
            Vec_IntInsert(&p->vTemp,1,OutItem);
            Prs_NtkAddBox(p->pNtk,Status,0,&p->vTemp);
            return 1;
          }
          Vec_IntPush(&p->vTemp,0);
          Vec_IntPush(&p->vTemp,iVar2);
          iVar2 = Prs_ManUtilSkipSpaces(p);
          if (iVar2 != 0) {
            iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
            return iVar2;
          }
          iVar2 = Prs_ManIsChar(p,'[');
          if (iVar2 != 0) {
            __assert_fail("!Prs_ManIsChar(p, \'[\')",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                          ,0x3cd,"int Prs_ManReadExpression(Prs_Man_t *, int)");
          }
          iVar2 = Prs_ManIsChar(p,',');
          if ((iVar2 == 0) && (iVar2 = Prs_ManIsChar(p,';'), iVar2 == 0)) {
            iVar2 = Prs_ManIsChar(p,'?');
            if (iVar2 == 0) {
              if (((*p->pCur == '>') && (p->pCur[1] == '>')) && (p->pCur[2] != '>')) {
                p->pCur = p->pCur + 2;
                Status = 0x42;
                if (bVar1) {
                  Status = 0x46;
                }
              }
              else if (((*p->pCur == '>') && (p->pCur[1] == '>')) && (p->pCur[2] == '>')) {
                p->pCur = p->pCur + 3;
                Status = 0x44;
              }
              else if (((*p->pCur == '<') && (p->pCur[1] == '<')) && (p->pCur[2] != '<')) {
                p->pCur = p->pCur + 2;
                Status = 0x41;
                if (bVar1) {
                  Status = 0x45;
                }
              }
              else if (((*p->pCur == '<') && (p->pCur[1] == '<')) && (p->pCur[2] == '<')) {
                p->pCur = p->pCur + 3;
                Status = 0x43;
              }
              else if ((*p->pCur == '&') && (p->pCur[1] != '&')) {
                p->pCur = p->pCur + 1;
                Status = 10;
              }
              else if ((*p->pCur == '|') && (p->pCur[1] != '|')) {
                p->pCur = p->pCur + 1;
                Status = 0xc;
              }
              else if ((*p->pCur == '^') && (p->pCur[1] != '^')) {
                p->pCur = p->pCur + 1;
                Status = 0xe;
              }
              else if ((*p->pCur == '&') && (p->pCur[1] == '&')) {
                p->pCur = p->pCur + 2;
                Status = 0x22;
              }
              else if ((*p->pCur == '|') && (p->pCur[1] == '|')) {
                p->pCur = p->pCur + 2;
                Status = 0x24;
              }
              else if ((*p->pCur == '=') && (p->pCur[1] == '=')) {
                p->pCur = p->pCur + 2;
                Status = 0x3f;
              }
              else if ((*p->pCur == '!') && (p->pCur[1] == '=')) {
                p->pCur = p->pCur + 2;
                Status = 0x40;
              }
              else if ((*p->pCur == '<') && (p->pCur[1] != '=')) {
                p->pCur = p->pCur + 1;
                Status = 0x3b;
              }
              else if ((*p->pCur == '>') && (p->pCur[1] != '=')) {
                p->pCur = p->pCur + 1;
                Status = 0x3e;
              }
              else if ((*p->pCur == '<') && (p->pCur[1] == '=')) {
                p->pCur = p->pCur + 2;
                Status = 0x3c;
              }
              else if ((*p->pCur == '>') && (p->pCur[1] == '=')) {
                p->pCur = p->pCur + 2;
                Status = 0x3d;
              }
              else if (*p->pCur == '+') {
                p->pCur = p->pCur + 1;
                Status = 0x2f;
              }
              else if (*p->pCur == '-') {
                p->pCur = p->pCur + 1;
                Status = 0x30;
              }
              else if ((*p->pCur == '*') && (p->pCur[1] != '*')) {
                p->pCur = p->pCur + 1;
                Status = 0x31;
              }
              else if (*p->pCur == '/') {
                p->pCur = p->pCur + 1;
                Status = 0x33;
              }
              else if (*p->pCur == '%') {
                p->pCur = p->pCur + 1;
                Status = 0x34;
              }
              else {
                if ((*p->pCur != '*') || (p->pCur[1] != '*')) {
                  iVar2 = Prs_ManErrorSet(p,"Unsupported operation.",0);
                  return iVar2;
                }
                p->pCur = p->pCur + 2;
                Status = 0x36;
              }
              iVar2 = Prs_ManReadSignal(p);
              if (iVar2 == 0) {
                return 0;
              }
              Vec_IntPush(&p->vTemp,0);
              Vec_IntPush(&p->vTemp,iVar2);
              if (Status == 0x2f) {
                Vec_IntInsert(&p->vTemp,2,0);
                Vec_IntInsert(&p->vTemp,3,0);
              }
            }
            else {
              p->pCur = p->pCur + 1;
              iVar2 = Prs_ManReadSignal(p);
              if (iVar2 == 0) {
                return 0;
              }
              Vec_IntPush(&p->vTemp,0);
              Vec_IntPush(&p->vTemp,iVar2);
              iVar2 = Prs_ManUtilSkipSpaces(p);
              if (iVar2 != 0) {
                iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
                return iVar2;
              }
              iVar2 = Prs_ManIsChar(p,':');
              if (iVar2 == 0) {
                iVar2 = Prs_ManErrorSet(p,"MUX lacks the colon symbol (:).",0);
                return iVar2;
              }
              p->pCur = p->pCur + 1;
              iVar2 = Prs_ManReadSignal(p);
              if (iVar2 == 0) {
                return 0;
              }
              Vec_IntPush(&p->vTemp,0);
              Vec_IntPush(&p->vTemp,iVar2);
              iVar2 = Prs_ManUtilSkipSpaces(p);
              if (iVar2 != 0) {
                iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
                return iVar2;
              }
              iVar2 = Vec_IntSize(&p->vTemp);
              if (iVar2 != 8) {
                __assert_fail("Vec_IntSize(&p->vTemp) == 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                              ,0x3e2,"int Prs_ManReadExpression(Prs_Man_t *, int)");
              }
              Status = 0x12;
            }
          }
          else {
            Status = 8;
          }
        }
        else {
          iVar2 = Prs_ManIsChar(p,'!');
          if (iVar2 == 0) {
            iVar2 = Prs_ManIsChar(p,'~');
            if (iVar2 == 0) {
              iVar2 = Prs_ManIsChar(p,'@');
              if (iVar2 == 0) {
                iVar2 = Prs_ManIsChar(p,'&');
                if (iVar2 == 0) {
                  iVar2 = Prs_ManIsChar(p,'|');
                  if (iVar2 == 0) {
                    iVar2 = Prs_ManIsChar(p,'^');
                    if (iVar2 == 0) {
                      iVar2 = Prs_ManIsChar(p,'-');
                      if (iVar2 == 0) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                                      ,0x398,"int Prs_ManReadExpression(Prs_Man_t *, int)");
                      }
                      Status = 0x37;
                    }
                    else {
                      Status = 0x1f;
                    }
                  }
                  else {
                    Status = 0x1d;
                  }
                }
                else {
                  Status = 0x1b;
                }
              }
              else {
                Status = 0x38;
              }
            }
            else {
              Status = 9;
            }
          }
          else {
            Status = 0x21;
          }
          p->pCur = p->pCur + 1;
          iVar2 = Prs_ManUtilSkipSpaces(p);
          if (iVar2 != 0) {
            iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
            return iVar2;
          }
          iVar2 = Prs_ManIsChar(p,'(');
          if (iVar2 != 0) {
            pcVar4 = Prs_ManFindClosingParenthesis(p,'(',')');
            if (pcVar4 == (char *)0x0) {
              iVar2 = Prs_ManErrorSet(p,"Expecting closing parenthesis 2.",0);
              return iVar2;
            }
            *pcVar4 = ' ';
            *p->pCur = ' ';
          }
          iVar2 = Prs_ManUtilSkipSpaces(p);
          if (iVar2 != 0) {
            iVar2 = Prs_ManErrorSet(p,"Error number 24.",0);
            return iVar2;
          }
          iVar2 = Prs_ManReadSignal(p);
          if (iVar2 == 0) {
            iVar2 = Prs_ManErrorSet(p,"Cannot read name after a unary operator.",0);
            return iVar2;
          }
          Vec_IntPush(&p->vTemp,0);
          Vec_IntPush(&p->vTemp,iVar2);
        }
      }
      else {
        iVar2 = Prs_ManReadSignal(p);
        Vec_IntPush(&p->vTemp,0);
        Vec_IntPush(&p->vTemp,iVar2);
        Status = 8;
      }
      iVar2 = Prs_ManUtilSkipSpaces(p);
      if (iVar2 == 0) {
        if (bVar1) {
          Prs_ManUtilSkipUntilWord(p,";");
          p->pCur = p->pCur + -1;
        }
        else {
          iVar2 = Prs_ManIsChar(p,',');
          if ((iVar2 == 0) && (iVar2 = Prs_ManIsChar(p,';'), iVar2 == 0)) {
            iVar2 = Prs_ManErrorSet(p,"Trailing symbols on this line.",0);
            return iVar2;
          }
        }
        Prs_NtkAddBox(p->pNtk,Status,0,&p->vTemp);
        p_local._4_4_ = 1;
      }
      else {
        p_local._4_4_ = Prs_ManErrorSet(p,"Error number 24.",0);
      }
    }
    else {
      p_local._4_4_ = Prs_ManErrorSet(p,"Error number 24.",0);
    }
  }
  else {
    p_local._4_4_ = Prs_ManErrorSet(p,"Error number 24.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Prs_ManReadExpression( Prs_Man_t * p, int OutItem )
{
    char * pClose;
    int Item, Type = CBA_OBJ_NONE;
    int fRotating = 0;

    // write output name
    Vec_IntClear( &p->vTemp );
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, OutItem );
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    if ( Prs_ManIsChar(p, '(') )
    {
        // THIS IS A HACK TO DETECT rotating shifters:  try to find both << and >> on the same line
        if ( Prs_ManUtilDetectTwo(p, '>', '>') && Prs_ManUtilDetectTwo(p, '<', '<') )
            fRotating = 1;
        pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
        if ( pClose == NULL )
            return Prs_ManErrorSet(p, "Expecting closing parenthesis 1.", 0); 
        *p->pCur = *pClose = ' ';
    }
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    // read constant or concatenation
    if ( Prs_ManIsDigit(p) || Prs_ManIsChar(p, '{') )
    {
        Item = Prs_ManReadSignal( p );
        // write constant
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        Type = CBA_BOX_BUF;
    }
    else if ( Prs_ManIsChar(p, '!') || Prs_ManIsChar(p, '~') || Prs_ManIsChar(p, '@') ||
              Prs_ManIsChar(p, '&') || Prs_ManIsChar(p, '|') || Prs_ManIsChar(p, '^') || Prs_ManIsChar(p, '-') )
    {
        if ( Prs_ManIsChar(p, '!') )
            Type = CBA_BOX_LNOT;
        else if ( Prs_ManIsChar(p, '~') )
            Type = CBA_BOX_INV;
        else if ( Prs_ManIsChar(p, '@') )
            Type = CBA_BOX_SQRT;
        else if ( Prs_ManIsChar(p, '&') )
            Type = CBA_BOX_RAND;
        else if ( Prs_ManIsChar(p, '|') )
            Type = CBA_BOX_ROR;
        else if ( Prs_ManIsChar(p, '^') )
            Type = CBA_BOX_RXOR;
        else if ( Prs_ManIsChar(p, '-') )
            Type = CBA_BOX_MIN;
        else assert( 0 );
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // skip parentheses
        if ( Prs_ManIsChar(p, '(') )
        {
            pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
            if ( pClose == NULL )
                return Prs_ManErrorSet(p, "Expecting closing parenthesis 2.", 0); 
            *p->pCur = *pClose = ' ';
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a unary operator.", 0);
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
    }
    else
    {
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a binary operator.", 0);
        // check if this is a recent function
        if ( Abc_Lit2Var2(Item) == p->FuncNameId )
        {
            int Status, nInputs, RangeSize;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, '(') )       return Prs_ManErrorSet(p, "Error number 24.", 0);
            p->pCur++;
            Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
            nInputs = Vec_IntSize(&p->vTemp)/2;
            RangeSize = p->FuncRangeId ? Ptr_NtkRangeSize(p->pNtk, p->FuncRangeId) : 1;
            p->FuncNameId = p->FuncRangeId = 0;
            if ( Status == 0 )                  return 0;
            if ( nInputs == 1 )
                Type = CBA_BOX_DEC;
            else if ( nInputs == RangeSize + 1 )
                Type = CBA_BOX_SEL;
            else if ( nInputs == (1 << RangeSize) + 1 )
                Type = CBA_BOX_NMUX;
            else                                return Prs_ManErrorSet(p, "Cannot determine word-level operator.", 0);
            p->pCur++;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            // save word-level operator
            Vec_IntInsert( &p->vTemp, 0, 0 );
            Vec_IntInsert( &p->vTemp, 1, OutItem );
            Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
            return 1;
        }
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        assert( !Prs_ManIsChar(p, '[') );

        // get the next symbol
        if ( Prs_ManIsChar(p, ',') || Prs_ManIsChar(p, ';') )
            Type = CBA_BOX_BUF;
        else if ( Prs_ManIsChar(p, '?') )
        {
            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, ':') )       return Prs_ManErrorSet(p, "MUX lacks the colon symbol (:).", 0);

            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            assert( Vec_IntSize(&p->vTemp) == 8 );
            //ABC_SWAP( int, Vec_IntArray(&p->vTemp)[3], Vec_IntArray(&p->vTemp)[5] );
            Type = CBA_BOX_MUX;
        }
        else 
        {
                 if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] != '>' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTR : CBA_BOX_SHIR;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] == '>' )  p->pCur += 3, Type = CBA_BOX_SHIRA;      
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] != '<' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTL : CBA_BOX_SHIL;
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] == '<' )  p->pCur += 3, Type = CBA_BOX_SHILA;      
            else if ( p->pCur[0] == '&' && p->pCur[1] != '&'                      )  p->pCur += 1, Type = CBA_BOX_AND;       
            else if ( p->pCur[0] == '|' && p->pCur[1] != '|'                      )  p->pCur += 1, Type = CBA_BOX_OR;        
            else if ( p->pCur[0] == '^' && p->pCur[1] != '^'                      )  p->pCur += 1, Type = CBA_BOX_XOR;       
            else if ( p->pCur[0] == '&' && p->pCur[1] == '&'                      )  p->pCur += 2, Type = CBA_BOX_LAND;     
            else if ( p->pCur[0] == '|' && p->pCur[1] == '|'                      )  p->pCur += 2, Type = CBA_BOX_LOR;      
            else if ( p->pCur[0] == '=' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_EQU;      
            else if ( p->pCur[0] == '!' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_NEQU;      
            else if ( p->pCur[0] == '<' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_LTHAN;     
            else if ( p->pCur[0] == '>' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_MTHAN;     
            else if ( p->pCur[0] == '<' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_LETHAN;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_METHAN;  
            else if ( p->pCur[0] == '+'                                           )  p->pCur += 1, Type = CBA_BOX_ADD;       
            else if ( p->pCur[0] == '-'                                           )  p->pCur += 1, Type = CBA_BOX_SUB;       
            else if ( p->pCur[0] == '*' && p->pCur[1] != '*'                      )  p->pCur += 1, Type = CBA_BOX_MUL;     
            else if ( p->pCur[0] == '/'                                           )  p->pCur += 1, Type = CBA_BOX_DIV;        
            else if ( p->pCur[0] == '%'                                           )  p->pCur += 1, Type = CBA_BOX_MOD;   
            else if ( p->pCur[0] == '*' && p->pCur[1] == '*'                      )  p->pCur += 2, Type = CBA_BOX_POW;
            else return Prs_ManErrorSet(p, "Unsupported operation.", 0);

            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            // for adder insert carry-in
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 2, 0 );
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 3, 0 );
        }
    }
    if ( Prs_ManUtilSkipSpaces(p) )                              return Prs_ManErrorSet(p, "Error number 24.", 0);
    // make sure there is nothing left there
    if ( fRotating )
    {
        Prs_ManUtilSkipUntilWord(p, ";");
        p->pCur--;
    }
    else if ( !Prs_ManIsChar(p, ',') && !Prs_ManIsChar(p, ';') ) return Prs_ManErrorSet(p, "Trailing symbols on this line.", 0);
    // save binary operator
    Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
    return 1;
}